

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O2

void Fra_FramesConstrainNode(Aig_Man_t *pManFraig,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  uint __line;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pDriver;
  char *__assertion;
  long lVar6;
  
  pvVar2 = (pObj->field_5).pData;
  iVar1 = pObj->Id;
  lVar3 = *(long *)(*(long *)(*(long *)((long)pvVar2 + 0x30) + 8) + (long)iVar1 * 8);
  if (lVar3 == 0) {
    return;
  }
  if (*(int *)(lVar3 + 0x24) < iVar1) {
    lVar6 = (long)(iVar1 * *(int *)((long)pvVar2 + 0x18) + iFrame);
    pAVar4 = *(Aig_Obj_t **)(*(long *)((long)pvVar2 + 0x20) + lVar6 * 8);
    pAVar5 = *(Aig_Obj_t **)
              (*(long *)(*(long *)(lVar3 + 0x28) + 0x20) +
              (long)(*(int *)(lVar3 + 0x24) * *(int *)(*(long *)(lVar3 + 0x28) + 0x18) + iFrame) * 8
              );
    if (((ulong)pAVar5 ^ (ulong)pAVar4) < 2) {
      return;
    }
    *(ulong *)(*(long *)((long)pvVar2 + 0x20) + lVar6 * 8) =
         (ulong)((*(uint *)(lVar3 + 0x18) ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^ (ulong)pAVar5;
    pAVar4 = Aig_Exor(pManFraig,pAVar4,pAVar5);
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      pAVar5 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar5 = (Aig_Obj_t *)
               (ulong)(~((uint)pAVar4 ^ *(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18) >> 3)
                      & 1);
    }
    pDriver = (Aig_Obj_t *)((ulong)pAVar5 ^ (ulong)pAVar4);
    if ((pAVar5 == pAVar4) ||
       ((((uint)pDriver ^ *(uint *)(((ulong)pDriver & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0))
    {
      Aig_ObjCreateCo(pManFraig,pDriver);
      return;
    }
    __assertion = "Aig_ObjPhaseReal(pMiter) == 1";
    __line = 0x73;
  }
  else {
    __assertion = "pObjRepr->Id < pObj->Id";
    __line = 100;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                ,__line,"void Fra_FramesConstrainNode(Aig_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline void Fra_FramesConstrainNode( Aig_Man_t * pManFraig, Aig_Obj_t * pObj, int iFrame )
{
    Aig_Obj_t * pObjNew, * pObjNew2, * pObjRepr, * pObjReprNew, * pMiter;
    // skip nodes without representative
    if ( (pObjRepr = Fra_ClassObjRepr(pObj)) == NULL )
        return;
    assert( pObjRepr->Id < pObj->Id );
    // get the new node 
    pObjNew = Fra_ObjFraig( pObj, iFrame );
    // get the new node of the representative
    pObjReprNew = Fra_ObjFraig( pObjRepr, iFrame );
    // if this is the same node, no need to add constraints
    if ( Aig_Regular(pObjNew) == Aig_Regular(pObjReprNew) )
        return;
    // these are different nodes - perform speculative reduction
    pObjNew2 = Aig_NotCond( pObjReprNew, pObj->fPhase ^ pObjRepr->fPhase );
    // set the new node
    Fra_ObjSetFraig( pObj, iFrame, pObjNew2 );
    // add the constraint
    pMiter = Aig_Exor( pManFraig, pObjNew, pObjReprNew );
    pMiter = Aig_NotCond( pMiter, !Aig_ObjPhaseReal(pMiter) );
    assert( Aig_ObjPhaseReal(pMiter) == 1 );
    Aig_ObjCreateCo( pManFraig, pMiter );
}